

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O2

QString * __thiscall
QSslCertificate::subjectDisplayName(QString *__return_storage_ptr__,QSslCertificate *this)

{
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_60;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  local_48.size = 0;
  subjectInfo((QStringList *)&local_60,this,CommonName);
  QArrayDataPointer<QString>::operator=(&local_48,&local_60);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
  if (local_48.size == 0) {
    subjectInfo((QStringList *)&local_60,this,Organization);
    QArrayDataPointer<QString>::operator=(&local_48,&local_60);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
    if (local_48.size == 0) {
      subjectInfo((QStringList *)&local_60,this,OrganizationalUnitName);
      QArrayDataPointer<QString>::operator=(&local_48,&local_60);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
      if (local_48.size == 0) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        goto LAB_001bfd0d;
      }
    }
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&(local_48.ptr)->d);
LAB_001bfd0d:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslCertificate::subjectDisplayName() const
{
    QStringList names;
    names = subjectInfo(QSslCertificate::CommonName);
    if (!names.isEmpty())
        return names.constFirst();
    names = subjectInfo(QSslCertificate::Organization);
    if (!names.isEmpty())
        return names.constFirst();
    names = subjectInfo(QSslCertificate::OrganizationalUnitName);
    if (!names.isEmpty())
        return names.constFirst();

    return QString();
}